

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

ostream * Catch::operator<<(ostream *os,LazyExpression *lazyExpr)

{
  ITransientExpression *pIVar1;
  long lVar2;
  char *pcVar3;
  
  if (lazyExpr->m_isNegated == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"!",1);
  }
  pIVar1 = lazyExpr->m_transientExpression;
  if (pIVar1 == (ITransientExpression *)0x0) {
    pcVar3 = "{** error - unchecked empty expression requested **}";
    lVar2 = 0x34;
  }
  else {
    if ((lazyExpr->m_isNegated != true) || (pIVar1->m_isBinaryExpression != true)) {
      (**pIVar1->_vptr_ITransientExpression)(pIVar1,os);
      return os;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
    (**lazyExpr->m_transientExpression->_vptr_ITransientExpression)
              (lazyExpr->m_transientExpression,os);
    pcVar3 = ")";
    lVar2 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
  return os;
}

Assistant:

auto operator << (std::ostream &os, LazyExpression const &lazyExpr) -> std::ostream &{
        if (lazyExpr.m_isNegated)
            os << "!";

        if (lazyExpr) {
            if (lazyExpr.m_isNegated && lazyExpr.m_transientExpression->isBinaryExpression())
                os << "(" << *lazyExpr.m_transientExpression << ")";
            else
                os << *lazyExpr.m_transientExpression;
        }
        else {
            os << "{** error - unchecked empty expression requested **}";
        }
        return os;
    }